

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O2

Abc_Obj_t * Dec_SopToAig(Abc_Ntk_t *pNtk,char *pSop,Vec_Ptr_t *vFaninAigs)

{
  Dec_Node_t *pDVar1;
  Dec_Graph_t *pGraph;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  long lVar4;
  long lVar5;
  
  pGraph = Dec_Factor(pSop);
  lVar5 = 8;
  for (lVar4 = 0; lVar4 < pGraph->nLeaves; lVar4 = lVar4 + 1) {
    pDVar1 = pGraph->pNodes;
    pvVar2 = Vec_PtrEntry(vFaninAigs,(int)lVar4);
    *(void **)(&(pDVar1->eEdge0).field_0x0 + lVar5) = pvVar2;
    lVar5 = lVar5 + 0x18;
  }
  pAVar3 = Dec_GraphToNetwork(pNtk,pGraph);
  Dec_GraphFree(pGraph);
  return pAVar3;
}

Assistant:

Abc_Obj_t * Dec_SopToAig( Abc_Ntk_t * pNtk, char * pSop, Vec_Ptr_t * vFaninAigs )
{
    Abc_Obj_t * pFunc;
    Dec_Graph_t * pFForm;
    Dec_Node_t * pNode;
    int i;
    pFForm = Dec_Factor( pSop );
    Dec_GraphForEachLeaf( pFForm, pNode, i )
        pNode->pFunc = Vec_PtrEntry( vFaninAigs, i );
    pFunc = Dec_GraphToNetwork( pNtk, pFForm );
    Dec_GraphFree( pFForm );
    return pFunc;
}